

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

void __thiscall OPL::DOSBox::DBOPL::Chip::GenerateBlock2(Chip *this,Bitu total,Bit32s *output)

{
  byte bVar1;
  Bit32u BVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  Channel *pCVar6;
  code *pcVar7;
  ulong uVar8;
  
  if (total != 0) {
    do {
      bVar1 = *(byte *)((long)&VibratoTable + (ulong)(this->vibratoIndex >> 2));
      this->vibratoSign = (char)bVar1 >> 7;
      this->vibratoShift = (bVar1 & 7) + this->vibratoStrength;
      bVar1 = this->tremoloIndex;
      this->tremoloValue = (byte)(&TremoloTable)[bVar1] >> (this->tremoloStrength & 0x1f);
      BVar2 = this->lfoCounter;
      uVar3 = this->lfoAdd;
      uVar4 = ((uVar3 - BVar2) + 0xfffff) / uVar3;
      if (total < uVar4) {
        this->lfoCounter = uVar3 * total + BVar2;
        uVar4 = total;
      }
      else {
        this->lfoCounter = uVar3 * uVar4 + BVar2 & 0xfffff;
        this->vibratoIndex = this->vibratoIndex + 1 & 0x1f;
        if (bVar1 < 0x33) {
          this->tremoloIndex = bVar1 + 1;
        }
        else {
          this->tremoloIndex = '\0';
        }
      }
      uVar8 = (ulong)uVar4;
      memset(output,0,uVar8 * 4);
      pCVar6 = this->chan;
      do {
        pcVar7 = (code *)pCVar6->synthHandler;
        plVar5 = (long *)((long)&pCVar6->op[0].volHandler + *(long *)&pCVar6->field_0xd8);
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *plVar5 + -1);
        }
        pCVar6 = (Channel *)(*pcVar7)(plVar5,this,uVar8,output);
      } while (pCVar6 < this->chan + 9);
      output = output + uVar8;
      total = total - uVar4;
    } while (total != 0);
  }
  return;
}

Assistant:

void Chip::GenerateBlock2( Bitu total, Bit32s* output ) {
	while ( total > 0 ) {
		Bit32u samples = ForwardLFO( total );
		memset(output, 0, sizeof(Bit32s) * samples);
		int count = 0;
		for( Channel* ch = chan; ch < chan + 9; ) {
			count++;
			ch = (ch->*(ch->synthHandler))( this, samples, output );
		}
		total -= samples;
		output += samples;
	}
}